

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cc
# Opt level: O0

string * __thiscall
onmt::Tokenizer::detokenize
          (Tokenizer *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *words,vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *features,Ranges *ranges,bool merge_ranges)

{
  string *in_RDI;
  byte in_R9B;
  vector<unsigned_long,_std::allocator<unsigned_long>_> index_map;
  vector<onmt::Token,_std::allocator<onmt::Token>_> tokens;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000098;
  bool in_stack_000000a7;
  Ranges *in_stack_000000a8;
  vector<onmt::Token,_std::allocator<onmt::Token>_> *in_stack_000000b0;
  Tokenizer *in_stack_000000b8;
  vector<onmt::Token,_std::allocator<onmt::Token>_> *this_00;
  vector<onmt::Token,_std::allocator<onmt::Token>_> local_48;
  byte local_29;
  
  local_29 = in_R9B & 1;
  this_00 = &local_48;
  std::vector<onmt::Token,_std::allocator<onmt::Token>_>::vector
            ((vector<onmt::Token,_std::allocator<onmt::Token>_> *)0x3c223a);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x3c2249);
  parse_tokens((Tokenizer *)
               tokens.super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)tokens.super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>._M_impl.
                  super__Vector_impl_data._M_finish,
               (vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)tokens.super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>._M_impl.
                  super__Vector_impl_data._M_start,
               (vector<onmt::Token,_std::allocator<onmt::Token>_> *)
               index_map.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               index_map.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish);
  detokenize_abi_cxx11_
            (in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,in_stack_000000a7,
             in_stack_00000098);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00);
  std::vector<onmt::Token,_std::allocator<onmt::Token>_>::~vector(this_00);
  return in_RDI;
}

Assistant:

std::string Tokenizer::detokenize(const std::vector<std::string>& words,
                                    const std::vector<std::vector<std::string> >& features,
                                    Ranges* ranges, bool merge_ranges) const
  {
    std::vector<Token> tokens;
    std::vector<size_t> index_map;
    parse_tokens(words, features, tokens, &index_map);
    return detokenize(tokens, ranges, merge_ranges, &index_map);
  }